

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_xar.c
# Opt level: O0

void verify7(archive *a,archive_entry *ae)

{
  archive_entry *in_RSI;
  char *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  wchar_t in_stack_00000028;
  void *in_stack_ffffffffffffffd8;
  archive_entry *paVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  
  archive_entry_filetype(in_RSI);
  assertion_assert((char *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_entry_mode(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b8b44,in_stack_00000010);
  archive_entry_uid(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b8b80,in_stack_00000010);
  archive_entry_gid(in_RSI);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b8bbc,in_stack_00000010);
  archive_entry_uname(paVar1);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_gname(paVar1);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_pathname(paVar1);
  paVar1 = (archive_entry *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_hardlink(paVar1);
  assertion_assert((char *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),paVar1);
  archive_entry_symlink(paVar1);
  assertion_assert((char *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),paVar1);
  archive_entry_mtime(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1b8d33,
                      in_stack_00000010);
  return;
}

Assistant:

static void verify7(struct archive *a, struct archive_entry *ae)
{
	(void)a; /* UNUSED */
	assert(archive_entry_filetype(ae) == AE_IFREG);
	assertEqualInt(archive_entry_mode(ae) & 0777, 0644);
	assertEqualInt(archive_entry_uid(ae), UID);
	assertEqualInt(archive_entry_gid(ae), GID);
	assertEqualString(archive_entry_uname(ae), UNAME);
	assertEqualString(archive_entry_gname(ae), GNAME);
	assertEqualString(archive_entry_pathname(ae), "dir1/f1");
	assert(archive_entry_hardlink(ae) == NULL);
	assert(archive_entry_symlink(ae) == NULL);
	assertEqualInt(archive_entry_mtime(ae), 86401);
}